

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O3

void __thiscall ExprWriter::visit(ExprWriter *this,DoWhile *expr)

{
  ostream *poVar1;
  
  poVar1 = this->ss;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"do {",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*expr->body->_vptr_Expr[2])(expr->body,this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,"} while (",9);
  (*expr->cond->_vptr_Expr[2])(expr->cond,this);
  poVar1 = this->ss;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ExprWriter::visit(DoWhile& expr) {
    ss << "do {" << std::endl;
    expr.body->accept(*this);
    ss << "} while (";
    expr.cond->accept(*this);
    ss << ");" << std::endl;
}